

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilCountSuppSizes(Sim_Man_t *p,int fStruct)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_34;
  int local_30;
  int Counter;
  int v;
  int i;
  Abc_Obj_t *pNodeCi;
  Abc_Obj_t *pNode;
  int fStruct_local;
  Sim_Man_t *p_local;
  
  local_34 = 0;
  if (fStruct == 0) {
    for (Counter = 0; iVar1 = Abc_NtkCoNum(p->pNtk), Counter < iVar1; Counter = Counter + 1) {
      Abc_NtkCo(p->pNtk,Counter);
      for (local_30 = 0; iVar1 = Abc_NtkCiNum(p->pNtk), local_30 < iVar1; local_30 = local_30 + 1) {
        Abc_NtkCi(p->pNtk,local_30);
        local_34 = (uint)((*(uint *)((long)p->vSuppFun->pArray[Counter] + (long)(local_30 >> 5) * 4)
                          & 1 << ((byte)local_30 & 0x1f)) != 0) + local_34;
      }
    }
  }
  else {
    for (Counter = 0; iVar1 = Abc_NtkCoNum(p->pNtk), Counter < iVar1; Counter = Counter + 1) {
      pAVar2 = Abc_NtkCo(p->pNtk,Counter);
      for (local_30 = 0; iVar1 = Abc_NtkCiNum(p->pNtk), local_30 < iVar1; local_30 = local_30 + 1) {
        Abc_NtkCi(p->pNtk,local_30);
        local_34 = (uint)((*(uint *)((long)p->vSuppStr->pArray[pAVar2->Id] +
                                    (long)(local_30 >> 5) * 4) & 1 << ((byte)local_30 & 0x1f)) != 0)
                   + local_34;
      }
    }
  }
  return local_34;
}

Assistant:

int Sim_UtilCountSuppSizes( Sim_Man_t * p, int fStruct )
{
    Abc_Obj_t * pNode, * pNodeCi;
    int i, v, Counter;
    Counter = 0;
    if ( fStruct )
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppStrHasVar( p->vSuppStr, pNode, v );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppFunHasVar( p->vSuppFun, i, v );
    }
    return Counter;
}